

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress1X2_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined2 *puVar1;
  long lVar2;
  uint nbBits;
  BIT_DStream_status BVar3;
  size_t sVar4;
  undefined2 *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  BIT_DStream_t bitD;
  
  sVar4 = BIT_initDStream(&bitD,cSrc,cSrcSize);
  if (sVar4 < 0xffffffffffffff89) {
    puVar1 = (undefined2 *)((long)dst + dstSize);
    nbBits = (uint)*(byte *)((long)DTable + 2);
    puVar5 = (undefined2 *)((long)dst + (dstSize - 7));
    while ((BVar3 = BIT_reloadDStream(&bitD), dst < puVar5 && (BVar3 == BIT_DStream_unfinished))) {
      sVar4 = BIT_lookBitsFast(&bitD,nbBits);
      *(short *)dst = (short)DTable[sVar4 + 1];
      uVar6 = *(byte *)((long)DTable + sVar4 * 4 + 6) + bitD.bitsConsumed;
      uVar7 = (ulong)*(byte *)((long)DTable + sVar4 * 4 + 7);
      bitD.bitsConsumed = uVar6;
      sVar4 = BIT_lookBitsFast(&bitD,nbBits);
      *(short *)((long)dst + uVar7) = (short)DTable[sVar4 + 1];
      uVar6 = *(byte *)((long)DTable + sVar4 * 4 + 6) + uVar6;
      uVar8 = (ulong)*(byte *)((long)DTable + sVar4 * 4 + 7);
      lVar2 = uVar8 + uVar7;
      bitD.bitsConsumed = uVar6;
      sVar4 = BIT_lookBitsFast(&bitD,nbBits);
      *(short *)((long)dst + uVar8 + uVar7) = (short)DTable[sVar4 + 1];
      uVar6 = *(byte *)((long)DTable + sVar4 * 4 + 6) + uVar6;
      uVar7 = (ulong)*(byte *)((long)DTable + sVar4 * 4 + 7);
      bitD.bitsConsumed = uVar6;
      sVar4 = BIT_lookBitsFast(&bitD,nbBits);
      *(short *)((long)dst + uVar7 + lVar2) = (short)DTable[sVar4 + 1];
      bitD.bitsConsumed = *(byte *)((long)DTable + sVar4 * 4 + 6) + uVar6;
      dst = (void *)((long)dst + *(byte *)((long)DTable + sVar4 * 4 + 7) + uVar7 + lVar2);
    }
    puVar5 = puVar1 + -1;
    while ((BVar3 = BIT_reloadDStream(&bitD), dst <= puVar5 && (BVar3 == BIT_DStream_unfinished))) {
      sVar4 = BIT_lookBitsFast(&bitD,nbBits);
      *(short *)dst = (short)DTable[sVar4 + 1];
      bitD.bitsConsumed = bitD.bitsConsumed + *(byte *)((long)DTable + sVar4 * 4 + 6);
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + sVar4 * 4 + 7));
    }
    for (; uVar6 = bitD.bitsConsumed, dst <= puVar5;
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + sVar4 * 4 + 7))) {
      sVar4 = BIT_lookBitsFast(&bitD,nbBits);
      *(short *)dst = (short)DTable[sVar4 + 1];
      bitD.bitsConsumed = uVar6 + *(byte *)((long)DTable + sVar4 * 4 + 6);
    }
    if (dst < puVar1) {
      sVar4 = BIT_lookBitsFast(&bitD,nbBits);
      *(char *)dst = (char)DTable[sVar4 + 1];
      if (*(char *)((long)DTable + sVar4 * 4 + 7) == '\x01') {
        uVar6 = uVar6 + *(byte *)((long)DTable + sVar4 * 4 + 6);
      }
      else if (uVar6 < 0x40) {
        uVar6 = uVar6 + *(byte *)((long)DTable + sVar4 * 4 + 6);
        if (0x3f < uVar6) {
          uVar6 = 0x40;
        }
      }
    }
    if (uVar6 != 0x40) {
      dstSize = 0xffffffffffffffec;
    }
    sVar4 = dstSize;
    if (bitD.ptr != bitD.start) {
      sVar4 = 0xffffffffffffffec;
    }
  }
  return sVar4;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)
HUF_DGEN(HUF_decompress4X2_usingDTable_internal)

size_t HUF_decompress1X2_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 1) return ERROR(GENERIC);
    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}